

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_integrate.cpp
# Opt level: O1

void __thiscall
numerary::TestIntegrate::test_integrate_simpson::test_method(test_integrate_simpson *this)

{
  double *pdVar1;
  double b;
  double a;
  double eps;
  double local_f0;
  double local_e8;
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  double local_c0;
  assertion_result local_b8;
  char *local_a0;
  char *local_98;
  const_string local_90;
  const_string local_80;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  local_c0 = 1e-09;
  local_e8 = 0.0;
  local_f0 = 1.0;
  local_e0._0_8_ = &local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"simpson","");
  pdVar1 = Numerary::integrate(test_integrate_function_1,&local_e8,&local_f0,(string *)local_e0,
                               &local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._0_8_ != &local_d0) {
    operator_delete((void *)local_e0._0_8_,local_d0._M_allocated_capacity + 1);
  }
  local_40.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_integrate.cpp"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x20,&local_50);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(ABS(*pdVar1 + -2.932941969615793) <= pdVar1[1]);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "fabs(I[0] - expected_result) <= I[1]";
  local_98 = "";
  local_e0[8] = false;
  local_e0._0_8_ = &PTR__lazy_ostream_001c0cb0;
  local_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_integrate.cpp"
  ;
  local_60.m_end = "";
  local_d0._8_8_ = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,(lazy_ostream *)local_e0,&local_60,0x20,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_e8 = -1.0;
  local_f0 = 1.0;
  local_e0._0_8_ = &local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"simpson","");
  pdVar1 = Numerary::integrate(test_integrate_function_2,&local_e8,&local_f0,(string *)local_e0,
                               &local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._0_8_ != &local_d0) {
    operator_delete((void *)local_e0._0_8_,(ulong)(local_d0._M_allocated_capacity + 1));
  }
  local_70.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_integrate.cpp"
  ;
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x28,&local_80);
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(ABS(*pdVar1 + -0.8414709848078965) <= pdVar1[1]);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "fabs(I[0] - expected_result) <= I[1]";
  local_98 = "";
  local_e0[8] = false;
  local_e0._0_8_ = &PTR__lazy_ostream_001c0cb0;
  local_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_90.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_integrate.cpp"
  ;
  local_90.m_end = "";
  local_d0._8_8_ = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,(lazy_ostream *)local_e0,&local_90,0x28,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  operator_delete__(pdVar1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_integrate_simpson)
    {
        const double eps = 1e-9;
        double *I = NULL;
        double a, b;
        double expected_result;

        // Testing \int_{0}^{1}\left(\5x^3 + 2cos(x)\right) dx
        a = 0.0;
        b = 1.0;
        expected_result = 2.93294196961579301330500464;
        I = Numerary::integrate(test_integrate_function_1, a, b, "simpson", eps);
        BOOST_CHECK(fabs(I[0] - expected_result) <= I[1]);


        // Testing \int_{-1}^{1} \left( \frac{\cos x}{1 +e^{\frac{1}{x}}} \right)
        a = -1.0;
        b = 1.0;
        expected_result = 0.8414709848078965066525023;
        I = Numerary::integrate(test_integrate_function_2, a, b, "simpson", eps);
        BOOST_CHECK(fabs(I[0] - expected_result) <= I[1]);

        delete[] I;
    }